

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O0

void __thiscall iutest::UnitTest::UnitTest(UnitTest *this)

{
  UnitTest *this_local;
  
  UnitTestImpl::UnitTestImpl(&this->super_UnitTestImpl);
  detail::ParamTestSuiteHolder::ParamTestSuiteHolder(&this->m_param_testsuite_holder);
  this->m_repeat_counter = 0;
  this->m_init_iutest_count = 0;
  this->m_test_started = false;
  this->m_start_timestamp = 0;
  detail::DefaultGlobalTestPartResultReporter::DefaultGlobalTestPartResultReporter
            (&this->m_default_test_part_result_reporter);
  TestEnv::SetGlobalTestPartResultReporter
            (&(this->m_default_test_part_result_reporter).super_TestPartResultReporterInterface);
  TestEnv::LoadEnvironmentVariable();
  return;
}

Assistant:

UnitTest()
        : m_repeat_counter(0)
        , m_init_iutest_count(0)
        , m_test_started(false)
        , m_start_timestamp(0)
    {
        // デフォルトリポーターをセット
        TestEnv::SetGlobalTestPartResultReporter(&m_default_test_part_result_reporter);
        // 環境変数によるテストフラグ指定をロード
        TestEnv::LoadEnvironmentVariable();
    }